

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringReader.cpp
# Opt level: O0

string * __thiscall
StringReader::getLineFromIndex_abi_cxx11_
          (string *__return_storage_ptr__,StringReader *this,size_t start)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  byte local_41;
  ulong local_28;
  size_t end;
  size_t start_local;
  StringReader *this_local;
  
  local_28 = start;
  while( true ) {
    uVar2 = std::__cxx11::string::length();
    local_41 = 0;
    if (local_28 < uVar2) {
      pcVar3 = (char *)std::__cxx11::string::at((ulong)&this->file);
      bVar1 = isNewLine(*pcVar3);
      local_41 = bVar1 ^ 0xff;
    }
    if ((local_41 & 1) == 0) break;
    local_28 = local_28 + 1;
  }
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&this->file);
  return __return_storage_ptr__;
}

Assistant:

const std::string StringReader::getLineFromIndex(std::size_t start) const {
  std::size_t end = start;
  while (end < this->file.length() && !isNewLine(this->file.at(end))) {
    end++;
  }
  return this->file.substr(start, end - start);
}